

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermIterators.hpp
# Opt level: O2

void __thiscall
Kernel::DisagreementSetIterator::DisagreementSetIterator
          (DisagreementSetIterator *this,Term *t1,Term *t2,bool disjunctVariables)

{
  (this->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt = 0;
  (this->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._vptr_IteratorCore =
       (_func_int **)&PTR__DisagreementSetIterator_009ffc30;
  Lib::Stack<Kernel::TermList_*>::Stack(&this->_stack,8);
  this->_disjunctVariables = disjunctVariables;
  (this->_arg1)._content = 2;
  (this->_arg2)._content = 2;
  reset(this,t1,t2,disjunctVariables);
  return;
}

Assistant:

DisagreementSetIterator(Term* t1, Term* t2, bool disjunctVariables=true)
  : _stack(8), _disjunctVariables(disjunctVariables)
  {
    reset(t1,t2,disjunctVariables);
  }